

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O3

void chapter3::query_map(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *families,string *query_name)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  ostream *poVar3;
  ostream *poVar4;
  const_iterator vend_iter;
  const_iterator viter;
  _Base_ptr p_Var5;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::find(&families->_M_t,query_name);
  if ((_Rb_tree_header *)cVar2._M_node == &(families->_M_t)._M_impl.super__Rb_tree_header) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Sorry, the ",0xb);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(query_name->_M_dataplus)._M_p,
                        query_name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," is not currently entered.",0x1a);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"The ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(query_name->_M_dataplus)._M_p,query_name->_M_string_length);
    p_Var5 = *(_Base_ptr *)(cVar2._M_node + 2);
    p_Var1 = cVar2._M_node[2]._M_parent;
    if (p_Var1 == p_Var5) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," has no children.\n",0x12);
      return;
    }
    poVar4 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," has ",5);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," children: ",0xb);
    do {
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)p_Var5,(long)p_Var5->_M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != p_Var1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

void chapter3::query_map(const map<string, vector<string>> &families, const string query_name) {
    map<string, vector<string>>::const_iterator it = families.find(query_name);

    if (it == families.end()) {
        cout << "Sorry, the " << query_name
             << " is not currently entered." << endl;
        return;
    }

    cout << "The " << query_name;
    if (!it->second.size()) {
        cout << " has no children.\n";
    } else {
        vector<string>::const_iterator viter = it->second.begin(), vend_iter = it->second.end();

        cout << " has " << it->second.size() << " children: ";
        while (viter != vend_iter) {
            cout << *viter << " ";
            ++viter;
        }
        cout << endl;
    }
}